

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

FieldBase * __thiscall FIX::FieldMap::reverse_find(FieldMap *this,int tag)

{
  int f;
  bool bVar1;
  FieldNotFound *this_00;
  reference pFVar2;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>_>
  local_20;
  const_reverse_iterator iter;
  int tag_local;
  FieldMap *this_local;
  
  iter.current._M_current._4_4_ = tag;
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::rbegin
            ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(local_30 + 8));
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::rend
            ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)local_30);
  finder::finder((finder *)(local_40 + 0xc),iter.current._M_current._4_4_);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>,FIX::FieldMap::finder>
            (&local_20,
             (reverse_iterator<__gnu_cxx::__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>_>
              *)(local_30 + 8),(finder)(int)local_30);
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::rend
            ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)local_40);
  bVar1 = std::operator==(&local_20,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>_>
                           *)local_40);
  if (!bVar1) {
    pFVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>_>
             ::operator*(&local_20);
    return pFVar2;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  f = iter.current._M_current._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  FieldNotFound::FieldNotFound(this_00,f,&local_60);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
}

Assistant:

const FieldBase& reverse_find( int tag ) const
  {
    Fields::const_reverse_iterator iter = std::find_if( m_fields.rbegin(), m_fields.rend(), finder( tag ) );
    if( iter == m_fields.rend() )
      throw FieldNotFound( tag );

    return *iter;
  }